

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O1

void __thiscall QBoxLayout::insertSpacerItem(QBoxLayout *this,int index,QSpacerItem *spacerItem)

{
  QBoxLayoutPrivate *this_00;
  int iVar1;
  QList<QBoxLayoutItem_*> *this_01;
  long in_FS_OFFSET;
  QBoxLayoutItem *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QBoxLayoutPrivate **)&(this->super_QLayout).field_0x8;
  iVar1 = QBoxLayoutPrivate::validateIndex(this_00,index);
  local_30 = (QBoxLayoutItem *)operator_new(0x10);
  local_30->item = &spacerItem->super_QLayoutItem;
  local_30->stretch = 0;
  local_30->magic = true;
  this_01 = &this_00->list;
  QtPrivate::QPodArrayOps<QBoxLayoutItem*>::emplace<QBoxLayoutItem*&>
            ((QPodArrayOps<QBoxLayoutItem*> *)this_01,(long)iVar1,&local_30);
  QList<QBoxLayoutItem_*>::begin(this_01);
  (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBoxLayout::insertSpacerItem(int index, QSpacerItem *spacerItem)
{
    Q_D(QBoxLayout);
    index = d->validateIndex(index);
    QBoxLayoutItem *it = new QBoxLayoutItem(spacerItem);
    it->magic = true;
    d->list.insert(index, it);
    invalidate();
}